

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::Collator::compareUTF8
          (Collator *this,StringPiece *source,StringPiece *target,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  undefined1 local_110 [8];
  UCharIterator tIter;
  UCharIterator sIter;
  UErrorCode *status_local;
  StringPiece *target_local;
  StringPiece *source_local;
  Collator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pcVar3 = StringPiece::data(source);
    iVar2 = StringPiece::length(source);
    uiter_setUTF8_63((UCharIterator *)&tIter.setState,pcVar3,iVar2);
    pcVar3 = StringPiece::data(target);
    iVar2 = StringPiece::length(target);
    uiter_setUTF8_63((UCharIterator *)local_110,pcVar3,iVar2);
    this_local._4_4_ =
         (*(this->super_UObject)._vptr_UObject[0xc])(this,&tIter.setState,local_110,status);
  }
  else {
    this_local._4_4_ = UCOL_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult Collator::compareUTF8(const StringPiece &source,
                                       const StringPiece &target,
                                       UErrorCode &status) const {
    if(U_FAILURE(status)) {
        return UCOL_EQUAL;
    }
    UCharIterator sIter, tIter;
    uiter_setUTF8(&sIter, source.data(), source.length());
    uiter_setUTF8(&tIter, target.data(), target.length());
    return compare(sIter, tIter, status);
}